

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O3

int xmlUTF8Charcmp(xmlChar *utf1,xmlChar *utf2)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  
  if (utf1 == (xmlChar *)0x0) {
    return -(uint)(utf2 != (xmlChar *)0x0);
  }
  bVar2 = *utf1;
  iVar4 = 1;
  if ((char)bVar2 < '\0') {
    iVar3 = 0;
    if ((bVar2 & 0x40) != 0) {
      uVar6 = 0x20;
      iVar4 = 2;
      do {
        if ((uVar6 & bVar2) == 0) goto LAB_001cee15;
        iVar4 = iVar4 + 1;
        uVar6 = uVar6 >> 1;
      } while (iVar4 != 8);
    }
  }
  else {
LAB_001cee15:
    if (utf1 == utf2) {
      return 0;
    }
    if (utf2 == (xmlChar *)0x0) {
      return 1;
    }
    lVar5 = 0;
    while( true ) {
      pbVar1 = utf2 + lVar5;
      iVar3 = (uint)utf1[lVar5] - (uint)*pbVar1;
      if (iVar3 != 0) break;
      if (iVar4 + -1 == (int)lVar5) {
        return 0;
      }
      lVar5 = lVar5 + 1;
      if (*pbVar1 == 0) {
        return 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int
xmlUTF8Charcmp(const xmlChar *utf1, const xmlChar *utf2) {

    if (utf1 == NULL ) {
        if (utf2 == NULL)
            return 0;
        return -1;
    }
    return xmlStrncmp(utf1, utf2, xmlUTF8Size(utf1));
}